

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O0

void __thiscall fizplex::Simplex::Simplex(Simplex *this,LP *_lp,int print_level_)

{
  LP *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  size_t i_1;
  size_t i;
  size_t structural_count;
  size_t in_stack_ffffffffffffff58;
  DVector *in_stack_ffffffffffffff60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  value_type_conflict1 *in_stack_ffffffffffffff68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = in_EDX;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x12f7ae);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x12f7c1);
  ColMatrix::col_count((ColMatrix *)*in_RDI);
  this_00 = (LP *)ColMatrix::row_count((ColMatrix *)*in_RDI);
  DVector::DVector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  ColMatrix::col_count((ColMatrix *)*in_RDI);
  ColMatrix::row_count((ColMatrix *)*in_RDI);
  DVector::DVector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  in_RDI[0xe] = 0x7ff0000000000000;
  *(undefined4 *)(in_RDI + 0xf) = 3;
  *(undefined4 *)((long)in_RDI + 0x7c) = 0;
  local_40 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             ColMatrix::col_count((ColMatrix *)*in_RDI);
  this_01 = local_40;
  LP::add_logicals(this_00);
  for (local_38 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0; local_38 < local_40;
      local_38 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(local_38->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (this_01,in_stack_ffffffffffffff68);
  }
  while (pvVar1 = local_40,
        __x = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              ColMatrix::col_count((ColMatrix *)*in_RDI), pvVar1 < __x) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (this_01,(value_type_conflict1 *)__x);
    local_40 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(local_40->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

Simplex::Simplex(LP &_lp, int print_level_)
    : lp(_lp), print_level(print_level_),
      x(lp.A.col_count() + lp.A.row_count()),
      c(lp.A.col_count() + lp.A.row_count()) {
  const size_t structural_count = lp.A.col_count();
  lp.add_logicals();
  for (size_t i = 0; i < structural_count; i++)
    non_basic_indices.push_back(i);
  for (size_t i = structural_count; i < lp.A.col_count(); i++)
    basic_indices.push_back(i);
}